

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O3

void duckdb::RowOperations::HeapScatterVData
               (UnifiedVectorFormat *vdata,PhysicalType type,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,optional_ptr<duckdb::NestedValidity,_true> parent_validity,
               idx_t offset)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  data_ptr_t pdVar4;
  unsigned_long *puVar5;
  int iVar6;
  undefined8 uVar7;
  ulong uVar8;
  byte *pbVar9;
  idx_t iVar10;
  NotImplementedException *this;
  byte bVar11;
  idx_t iVar12;
  ulong uVar13;
  undefined7 in_register_00000031;
  string local_50;
  
  iVar6 = (int)CONCAT71(in_register_00000031,type);
  local_50._M_dataplus._M_p = (pointer)parent_validity.ptr;
  switch(iVar6) {
  case 1:
  case 3:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar13 = iVar12 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar3[uVar13];
          }
          *key_locations[iVar10] = pdVar2[uVar13];
          key_locations[iVar10] = key_locations[iVar10] + 1;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      uVar13 = 0;
      do {
        uVar8 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar13];
        }
        uVar8 = uVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar8];
        }
        *key_locations[uVar13] = pdVar2[uVar8];
        key_locations[uVar13] = key_locations[uVar13] + 1;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          if (*(long *)local_50._M_dataplus._M_p == 0) {
            bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
            pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                     *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
          }
          else {
            bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
            pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                             (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
          }
          *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
        }
        uVar13 = uVar13 + 1;
      } while (ser_count != uVar13);
    }
    break;
  case 2:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar13 = iVar12 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar3[uVar13];
          }
          *key_locations[iVar10] = pdVar2[uVar13];
          key_locations[iVar10] = key_locations[iVar10] + 1;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      uVar13 = 0;
      do {
        uVar8 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar13];
        }
        uVar8 = uVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar8];
        }
        *key_locations[uVar13] = pdVar2[uVar8];
        key_locations[uVar13] = key_locations[uVar13] + 1;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          if (*(long *)local_50._M_dataplus._M_p == 0) {
            bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
            pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                     *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
          }
          else {
            bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
            pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                             (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
          }
          *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
        }
        uVar13 = uVar13 + 1;
      } while (ser_count != uVar13);
    }
    break;
  case 4:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar13 = iVar12 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar3[uVar13];
          }
          *(undefined2 *)key_locations[iVar10] = *(undefined2 *)(pdVar2 + uVar13 * 2);
          key_locations[iVar10] = key_locations[iVar10] + 2;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      uVar13 = 0;
      do {
        uVar8 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar13];
        }
        uVar8 = uVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar8];
        }
        *(undefined2 *)key_locations[uVar13] = *(undefined2 *)(pdVar2 + uVar8 * 2);
        key_locations[uVar13] = key_locations[uVar13] + 2;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          if (*(long *)local_50._M_dataplus._M_p == 0) {
            bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
            pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                     *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
          }
          else {
            bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
            pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                             (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
          }
          *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
        }
        uVar13 = uVar13 + 1;
      } while (ser_count != uVar13);
    }
    break;
  case 5:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar13 = iVar12 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar3[uVar13];
          }
          *(undefined2 *)key_locations[iVar10] = *(undefined2 *)(pdVar2 + uVar13 * 2);
          key_locations[iVar10] = key_locations[iVar10] + 2;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      uVar13 = 0;
      do {
        uVar8 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar13];
        }
        uVar8 = uVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar8];
        }
        *(undefined2 *)key_locations[uVar13] = *(undefined2 *)(pdVar2 + uVar8 * 2);
        key_locations[uVar13] = key_locations[uVar13] + 2;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          if (*(long *)local_50._M_dataplus._M_p == 0) {
            bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
            pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                     *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
          }
          else {
            bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
            pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                             (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
          }
          *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
        }
        uVar13 = uVar13 + 1;
      } while (ser_count != uVar13);
    }
    break;
  case 6:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar13 = iVar12 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar3[uVar13];
          }
          *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + uVar13 * 4);
          key_locations[iVar10] = key_locations[iVar10] + 4;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      uVar13 = 0;
      do {
        uVar8 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar13];
        }
        uVar8 = uVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar8];
        }
        *(undefined4 *)key_locations[uVar13] = *(undefined4 *)(pdVar2 + uVar8 * 4);
        key_locations[uVar13] = key_locations[uVar13] + 4;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          if (*(long *)local_50._M_dataplus._M_p == 0) {
            bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
            pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                     *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
          }
          else {
            bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
            pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                             (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
          }
          *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
        }
        uVar13 = uVar13 + 1;
      } while (ser_count != uVar13);
    }
    break;
  case 7:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar13 = iVar12 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar3[uVar13];
          }
          *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + uVar13 * 4);
          key_locations[iVar10] = key_locations[iVar10] + 4;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      uVar13 = 0;
      do {
        uVar8 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar13];
        }
        uVar8 = uVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar8];
        }
        *(undefined4 *)key_locations[uVar13] = *(undefined4 *)(pdVar2 + uVar8 * 4);
        key_locations[uVar13] = key_locations[uVar13] + 4;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          if (*(long *)local_50._M_dataplus._M_p == 0) {
            bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
            pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                     *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
          }
          else {
            bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
            pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                             (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
          }
          *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
        }
        uVar13 = uVar13 + 1;
      } while (ser_count != uVar13);
    }
    break;
  case 8:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar13 = iVar12 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar3[uVar13];
          }
          *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + uVar13 * 8);
          key_locations[iVar10] = key_locations[iVar10] + 8;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      uVar13 = 0;
      do {
        uVar8 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar13];
        }
        uVar8 = uVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar8];
        }
        *(undefined8 *)key_locations[uVar13] = *(undefined8 *)(pdVar2 + uVar8 * 8);
        key_locations[uVar13] = key_locations[uVar13] + 8;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          if (*(long *)local_50._M_dataplus._M_p == 0) {
            bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
            pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                     *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
          }
          else {
            bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
            pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                             (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
          }
          *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
        }
        uVar13 = uVar13 + 1;
      } while (ser_count != uVar13);
    }
    break;
  case 9:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar13 = iVar12 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar3[uVar13];
          }
          *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + uVar13 * 8);
          key_locations[iVar10] = key_locations[iVar10] + 8;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      uVar13 = 0;
      do {
        uVar8 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar13];
        }
        uVar8 = uVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar8];
        }
        *(undefined8 *)key_locations[uVar13] = *(undefined8 *)(pdVar2 + uVar8 * 8);
        key_locations[uVar13] = key_locations[uVar13] + 8;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          if (*(long *)local_50._M_dataplus._M_p == 0) {
            bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
            pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                     *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
          }
          else {
            bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
            pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                             (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
          }
          *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
        }
        uVar13 = uVar13 + 1;
      } while (ser_count != uVar13);
    }
    break;
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_015aa2bd_caseD_a:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"FIXME: Serialize to of constant type column to row-format","");
    NotImplementedException::NotImplementedException(this,&local_50);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 0xb:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar13 = iVar12 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar3[uVar13];
          }
          *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + uVar13 * 4);
          key_locations[iVar10] = key_locations[iVar10] + 4;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      uVar13 = 0;
      do {
        uVar8 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar13];
        }
        uVar8 = uVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar8];
        }
        *(undefined4 *)key_locations[uVar13] = *(undefined4 *)(pdVar2 + uVar8 * 4);
        key_locations[uVar13] = key_locations[uVar13] + 4;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          if (*(long *)local_50._M_dataplus._M_p == 0) {
            bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
            pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                     *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
          }
          else {
            bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
            pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                             (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
          }
          *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
        }
        uVar13 = uVar13 + 1;
      } while (ser_count != uVar13);
    }
    break;
  case 0xc:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar13 = iVar12 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar3[uVar13];
          }
          *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + uVar13 * 8);
          key_locations[iVar10] = key_locations[iVar10] + 8;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      uVar13 = 0;
      do {
        uVar8 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar13];
        }
        uVar8 = uVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar8];
        }
        *(undefined8 *)key_locations[uVar13] = *(undefined8 *)(pdVar2 + uVar8 * 8);
        key_locations[uVar13] = key_locations[uVar13] + 8;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          if (*(long *)local_50._M_dataplus._M_p == 0) {
            bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
            pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                     *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
          }
          else {
            bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
            pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                             (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
          }
          *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
        }
        uVar13 = uVar13 + 1;
      } while (ser_count != uVar13);
    }
    break;
  case 0x15:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar13 = iVar12 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar3[uVar13];
          }
          pdVar4 = key_locations[iVar10];
          pdVar1 = pdVar2 + uVar13 * 0x10;
          uVar7 = *(undefined8 *)(pdVar1 + 8);
          *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
          *(undefined8 *)(pdVar4 + 8) = uVar7;
          key_locations[iVar10] = key_locations[iVar10] + 0x10;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      uVar13 = 0;
      do {
        uVar8 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)sel->sel_vector[uVar13];
        }
        uVar8 = uVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar8];
        }
        pdVar4 = key_locations[uVar13];
        pdVar1 = pdVar2 + uVar8 * 0x10;
        uVar7 = *(undefined8 *)(pdVar1 + 8);
        *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
        *(undefined8 *)(pdVar4 + 8) = uVar7;
        key_locations[uVar13] = key_locations[uVar13] + 0x10;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          if (*(long *)local_50._M_dataplus._M_p == 0) {
            bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
            pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                     *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
          }
          else {
            bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
            pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                             (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
          }
          *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
        }
        uVar13 = uVar13 + 1;
      } while (ser_count != uVar13);
    }
    break;
  default:
    if (iVar6 == 0xcb) {
      pdVar2 = vdata->data;
      if (parent_validity.ptr == (NestedValidity *)0x0) {
        if (ser_count != 0) {
          iVar10 = 0;
          do {
            iVar12 = iVar10;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar12 = (idx_t)sel->sel_vector[iVar10];
            }
            uVar13 = iVar12 + offset;
            psVar3 = vdata->sel->sel_vector;
            if (psVar3 != (sel_t *)0x0) {
              uVar13 = (ulong)psVar3[uVar13];
            }
            pdVar4 = key_locations[iVar10];
            pdVar1 = pdVar2 + uVar13 * 0x10;
            uVar7 = *(undefined8 *)(pdVar1 + 8);
            *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
            *(undefined8 *)(pdVar4 + 8) = uVar7;
            key_locations[iVar10] = key_locations[iVar10] + 0x10;
            iVar10 = iVar10 + 1;
          } while (ser_count != iVar10);
        }
      }
      else if (ser_count != 0) {
        uVar13 = 0;
        do {
          uVar8 = uVar13;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)sel->sel_vector[uVar13];
          }
          uVar8 = uVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar8 = (ulong)psVar3[uVar8];
          }
          pdVar4 = key_locations[uVar13];
          pdVar1 = pdVar2 + uVar8 * 0x10;
          uVar7 = *(undefined8 *)(pdVar1 + 8);
          *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
          *(undefined8 *)(pdVar4 + 8) = uVar7;
          key_locations[uVar13] = key_locations[uVar13] + 0x10;
          puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0))
          {
            optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                      ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
            if (*(long *)local_50._M_dataplus._M_p == 0) {
              bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
              pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                       *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
            }
            else {
              bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
              pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                               (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
            }
            *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
          }
          uVar13 = uVar13 + 1;
        } while (ser_count != uVar13);
      }
    }
    else {
      if (iVar6 != 0xcc) goto switchD_015aa2bd_caseD_a;
      pdVar2 = vdata->data;
      if (parent_validity.ptr == (NestedValidity *)0x0) {
        if (ser_count != 0) {
          iVar10 = 0;
          do {
            iVar12 = iVar10;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar12 = (idx_t)sel->sel_vector[iVar10];
            }
            uVar13 = iVar12 + offset;
            psVar3 = vdata->sel->sel_vector;
            if (psVar3 != (sel_t *)0x0) {
              uVar13 = (ulong)psVar3[uVar13];
            }
            pdVar4 = key_locations[iVar10];
            pdVar1 = pdVar2 + uVar13 * 0x10;
            uVar7 = *(undefined8 *)(pdVar1 + 8);
            *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
            *(undefined8 *)(pdVar4 + 8) = uVar7;
            key_locations[iVar10] = key_locations[iVar10] + 0x10;
            iVar10 = iVar10 + 1;
          } while (ser_count != iVar10);
        }
      }
      else if (ser_count != 0) {
        uVar13 = 0;
        do {
          uVar8 = uVar13;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)sel->sel_vector[uVar13];
          }
          uVar8 = uVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar8 = (ulong)psVar3[uVar8];
          }
          pdVar4 = key_locations[uVar13];
          pdVar1 = pdVar2 + uVar8 * 0x10;
          uVar7 = *(undefined8 *)(pdVar1 + 8);
          *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
          *(undefined8 *)(pdVar4 + 8) = uVar7;
          key_locations[uVar13] = key_locations[uVar13] + 0x10;
          puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0))
          {
            optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                      ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
            if (*(long *)local_50._M_dataplus._M_p == 0) {
              bVar11 = (byte)*(idx_t *)(local_50._M_dataplus._M_p + 0x18);
              pbVar9 = (*(data_ptr_t **)(local_50._M_dataplus._M_p + 8))[uVar13] +
                       *(idx_t *)(local_50._M_dataplus._M_p + 0x10);
            }
            else {
              bVar11 = (byte)(*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13) & 7;
              pbVar9 = (byte *)(*(long *)local_50._M_dataplus._M_p +
                               (*(idx_t *)(local_50._M_dataplus._M_p + 0x20) + uVar13 >> 3));
            }
            *pbVar9 = *pbVar9 & ~(byte)(1L << (bVar11 & 0x3f));
          }
          uVar13 = uVar13 + 1;
        } while (ser_count != uVar13);
      }
    }
  }
  return;
}

Assistant:

void RowOperations::HeapScatterVData(UnifiedVectorFormat &vdata, PhysicalType type, const SelectionVector &sel,
                                     idx_t ser_count, data_ptr_t *key_locations,
                                     optional_ptr<NestedValidity> parent_validity, idx_t offset) {
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedHeapScatter<int8_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INT16:
		TemplatedHeapScatter<int16_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INT32:
		TemplatedHeapScatter<int32_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INT64:
		TemplatedHeapScatter<int64_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT8:
		TemplatedHeapScatter<uint8_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT16:
		TemplatedHeapScatter<uint16_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT32:
		TemplatedHeapScatter<uint32_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT64:
		TemplatedHeapScatter<uint64_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INT128:
		TemplatedHeapScatter<hugeint_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT128:
		TemplatedHeapScatter<uhugeint_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::FLOAT:
		TemplatedHeapScatter<float>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::DOUBLE:
		TemplatedHeapScatter<double>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INTERVAL:
		TemplatedHeapScatter<interval_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	default:
		throw NotImplementedException("FIXME: Serialize to of constant type column to row-format");
	}
}